

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O0

void __thiscall optimization::livevar_analyse::Livevar_Analyse::build(Livevar_Analyse *this)

{
  bool bVar1;
  size_type sVar2;
  undefined8 in_RDI;
  sharedPtrVariableSet empty;
  iterator end;
  BasicBlk *in_stack_00000088;
  Livevar_Analyse *in_stack_00000090;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  int iVar3;
  _Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *in_stack_ffffffffffffffc8;
  
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  sVar2 = std::
          map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
          ::size((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)0x143430);
  if (sVar2 != 0) {
    std::
    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
    ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
              (in_stack_ffffffffffffffc8,iVar3);
    std::
    make_shared<std::set<mir::inst::VarId,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>>
              ();
    do {
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x143477);
      bVar1 = bfs_build(in_stack_00000090,in_stack_00000088);
    } while (bVar1);
    std::
    shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
    ::~shared_ptr((shared_ptr<std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>
                   *)0x1434be);
  }
  return;
}

Assistant:

void build() {
    if (!func.basic_blks.size()) {
      return;
    }

    auto end = func.basic_blks.end();
    end--;
    sharedPtrVariableSet empty = std::make_shared<VariableSet>();
    while (bfs_build(end->second))
      ;

    // for (auto& pair : livevars) {
    //   LOG(TRACE) << pair.first << ": " << std::endl;
    //   for (auto var : *pair.second->live_vars_in) {
    //     LOG(TRACE) << var << ", ";
    //   }
    //   LOG(TRACE) << std::endl;
    //   for (auto ilv : pair.second->instLiveVars) {
    //     for (auto var : *ilv) {
    //       LOG(TRACE) << var << ", ";
    //     }
    //     LOG(TRACE) << std::endl;
    //   }
    //   LOG(TRACE) << "******************" << std::endl;
    // }
  }